

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<9>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  uint32 value_00;
  int size;
  void *data;
  Type *value;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  value_00 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(output,value_00);
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased(output,data,size);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    const Type& value = *static_cast<const Type*>(ptr);
    output->WriteVarint32(value.size());
    output->WriteRawMaybeAliased(value.data(), value.size());
  }